

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O0

TestStatus * __thiscall
vkt::api::anon_unknown_1::
createMultipleSharedResourcesTest<vkt::api::(anonymous_namespace)::QueryPool>
          (TestStatus *__return_storage_ptr__,anon_unknown_1 *this,Context *context,
          Parameters params)

{
  Resources *this_00;
  RefData<vk::Handle<(vk::HandleType)11>_> data;
  RefData<vk::Handle<(vk::HandleType)11>_> data_00;
  RefData<vk::Handle<(vk::HandleType)11>_> data_01;
  RefData<vk::Handle<(vk::HandleType)11>_> data_02;
  allocator<char> local_229;
  string local_228;
  Move<vk::Handle<(vk::HandleType)11>_> local_208;
  RefData<vk::Handle<(vk::HandleType)11>_> local_1e8;
  undefined1 local_1c8 [8];
  Unique<vk::Handle<(vk::HandleType)11>_> obj3;
  RefData<vk::Handle<(vk::HandleType)11>_> local_188;
  undefined1 local_168 [8];
  Unique<vk::Handle<(vk::HandleType)11>_> obj2;
  RefData<vk::Handle<(vk::HandleType)11>_> local_128;
  undefined1 local_108 [8];
  Unique<vk::Handle<(vk::HandleType)11>_> obj1;
  Move<vk::Handle<(vk::HandleType)11>_> local_d8;
  RefData<vk::Handle<(vk::HandleType)11>_> local_b8;
  undefined1 local_98 [8];
  Unique<vk::Handle<(vk::HandleType)11>_> obj0;
  undefined1 local_70 [7];
  Resources res;
  Environment env;
  Context *context_local;
  Context *local_20;
  Parameters params_local;
  
  params_local.queryType = params.queryType;
  local_20 = context;
  unique0x1000098f = __return_storage_ptr__;
  Environment::Environment((Environment *)local_70,(Context *)this,4);
  this_00 = (Resources *)
            ((long)&obj0.super_RefBase<vk::Handle<(vk::HandleType)11>_>.m_data.deleter.m_allocator +
            7);
  QueryPool::Resources::Resources(this_00,(Environment *)local_70,(Parameters *)&local_20);
  QueryPool::create(&local_d8,(Environment *)local_70,this_00,(Parameters *)&local_20);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_b8,(Move *)&local_d8);
  data.deleter.m_deviceIface = local_b8.deleter.m_deviceIface;
  data.object.m_internal = local_b8.object.m_internal;
  data.deleter.m_device = local_b8.deleter.m_device;
  data.deleter.m_allocator = local_b8.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)11>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)11>_> *)local_98,data);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)11>_>::~Move(&local_d8);
  QueryPool::create((Move<vk::Handle<(vk::HandleType)11>_> *)
                    &obj2.super_RefBase<vk::Handle<(vk::HandleType)11>_>.m_data.deleter.m_allocator,
                    (Environment *)local_70,
                    (Resources *)
                    ((long)&obj0.super_RefBase<vk::Handle<(vk::HandleType)11>_>.m_data.deleter.
                            m_allocator + 7),(Parameters *)&local_20);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_128,
             (Move *)&obj2.super_RefBase<vk::Handle<(vk::HandleType)11>_>.m_data.deleter.m_allocator
            );
  data_00.deleter.m_deviceIface = local_128.deleter.m_deviceIface;
  data_00.object.m_internal = local_128.object.m_internal;
  data_00.deleter.m_device = local_128.deleter.m_device;
  data_00.deleter.m_allocator = local_128.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)11>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)11>_> *)local_108,data_00);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)11>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)11>_> *)
             &obj2.super_RefBase<vk::Handle<(vk::HandleType)11>_>.m_data.deleter.m_allocator);
  QueryPool::create((Move<vk::Handle<(vk::HandleType)11>_> *)
                    &obj3.super_RefBase<vk::Handle<(vk::HandleType)11>_>.m_data.deleter.m_allocator,
                    (Environment *)local_70,
                    (Resources *)
                    ((long)&obj0.super_RefBase<vk::Handle<(vk::HandleType)11>_>.m_data.deleter.
                            m_allocator + 7),(Parameters *)&local_20);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_188,
             (Move *)&obj3.super_RefBase<vk::Handle<(vk::HandleType)11>_>.m_data.deleter.m_allocator
            );
  data_01.deleter.m_deviceIface = local_188.deleter.m_deviceIface;
  data_01.object.m_internal = local_188.object.m_internal;
  data_01.deleter.m_device = local_188.deleter.m_device;
  data_01.deleter.m_allocator = local_188.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)11>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)11>_> *)local_168,data_01);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)11>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)11>_> *)
             &obj3.super_RefBase<vk::Handle<(vk::HandleType)11>_>.m_data.deleter.m_allocator);
  QueryPool::create(&local_208,(Environment *)local_70,
                    (Resources *)
                    ((long)&obj0.super_RefBase<vk::Handle<(vk::HandleType)11>_>.m_data.deleter.
                            m_allocator + 7),(Parameters *)&local_20);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_1e8,(Move *)&local_208);
  data_02.deleter.m_deviceIface = local_1e8.deleter.m_deviceIface;
  data_02.object.m_internal = local_1e8.object.m_internal;
  data_02.deleter.m_device = local_1e8.deleter.m_device;
  data_02.deleter.m_allocator = local_1e8.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)11>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)11>_> *)local_1c8,data_02);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)11>_>::~Move(&local_208);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)11>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)11>_> *)local_1c8);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)11>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)11>_> *)local_168);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)11>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)11>_> *)local_108);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)11>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)11>_> *)local_98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_228,"Ok",&local_229);
  tcu::TestStatus::pass(__return_storage_ptr__,&local_228);
  std::__cxx11::string::~string((string *)&local_228);
  std::allocator<char>::~allocator(&local_229);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus createMultipleSharedResourcesTest (Context& context, typename Object::Parameters params)
{
	const Environment					env	(context, 4u);
	const typename Object::Resources	res	(env, params);

	{
		Unique<typename Object::Type>	obj0	(Object::create(env, res, params));
		Unique<typename Object::Type>	obj1	(Object::create(env, res, params));
		Unique<typename Object::Type>	obj2	(Object::create(env, res, params));
		Unique<typename Object::Type>	obj3	(Object::create(env, res, params));
	}

	return tcu::TestStatus::pass("Ok");
}